

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlTextWriterWriteBase64(xmlTextWriterPtr writer,char *data,int start,int len)

{
  int iVar1;
  xmlLinkPtr lk_00;
  xmlTextWriterStackEntry *p_00;
  xmlTextWriterStackEntry *p;
  xmlLinkPtr lk;
  int sum;
  int count;
  int len_local;
  int start_local;
  char *data_local;
  xmlTextWriterPtr writer_local;
  
  if ((((writer == (xmlTextWriterPtr)0x0) || (data == (char *)0x0)) || (start < 0)) || (len < 0)) {
    writer_local._4_4_ = -1;
  }
  else {
    lk._0_4_ = 0;
    lk_00 = xmlListFront(writer->nodes);
    if (((lk_00 == (xmlLinkPtr)0x0) ||
        (p_00 = (xmlTextWriterStackEntry *)xmlLinkGetData(lk_00),
        p_00 == (xmlTextWriterStackEntry *)0x0)) ||
       (lk._0_4_ = xmlTextWriterHandleStateDependencies(writer,p_00), -1 < (int)lk)) {
      if (writer->indent != 0) {
        writer->doindent = 0;
      }
      iVar1 = xmlOutputBufferWriteBase64(writer->out,len,(uchar *)(data + start));
      if (iVar1 < 0) {
        writer_local._4_4_ = -1;
      }
      else {
        writer_local._4_4_ = iVar1 + (int)lk;
      }
    }
    else {
      writer_local._4_4_ = -1;
    }
  }
  return writer_local._4_4_;
}

Assistant:

int
xmlTextWriterWriteBase64(xmlTextWriterPtr writer, const char *data,
                         int start, int len)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;

    if ((writer == NULL) || (data == NULL) || (start < 0) || (len < 0))
        return -1;

    sum = 0;
    lk = xmlListFront(writer->nodes);
    if (lk != 0) {
        p = (xmlTextWriterStackEntry *) xmlLinkGetData(lk);
        if (p != 0) {
            count = xmlTextWriterHandleStateDependencies(writer, p);
            if (count < 0)
                return -1;
            sum += count;
        }
    }

    if (writer->indent)
        writer->doindent = 0;

    count =
        xmlOutputBufferWriteBase64(writer->out, len,
                                   (unsigned char *) data + start);
    if (count < 0)
        return -1;
    sum += count;

    return sum;
}